

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall
InitSocket::NotifyOnAddressChanges
          (InitSocket *this,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
          *vNewListing)

{
  mutex *__mutex;
  _Tuple_impl<1UL,_int,_int> *p_Var1;
  InitSocket *pIVar2;
  bool bVar3;
  int iVar4;
  pointer ptVar5;
  long lVar6;
  _Tuple_impl<1UL,_int,_int> *p_Var7;
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  *this_00;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
  __it;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
  __it_00;
  _Tuple_impl<1UL,_int,_int> __position;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
  __position_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  vDelIPAddr;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pointer local_70;
  InitSocket *local_68;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *local_60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_58;
  pthread_mutex_t *local_38;
  
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->m_mxCurIpAddr;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_60 = &this->m_vCurIPAddr;
  __position = (_Tuple_impl<1UL,_int,_int>)
               (this->m_vCurIPAddr).
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_68 = this;
  local_38 = (pthread_mutex_t *)__mutex;
  if (__position !=
      (_Tuple_impl<1UL,_int,_int>)
      (this->m_vCurIPAddr).
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      __it._M_current =
           (vNewListing->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      ptVar5 = (vNewListing->
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = ((long)ptVar5 - (long)__it._M_current >> 3) * -0x3333333333333333 >> 2;
      __it_00._M_current = __it._M_current;
      local_98 = (undefined1  [8])__position;
      if (0 < lVar6) {
        __it_00._M_current = __it._M_current + lVar6 * 4;
        lVar6 = lVar6 + 1;
        local_70 = ptVar5;
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)local_98,__it);
          ptVar5 = local_70;
          __position_00._M_current = __it._M_current;
          if (bVar3) goto LAB_00116a8a;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)local_98,__it._M_current + 1);
          ptVar5 = local_70;
          __position_00._M_current = __it._M_current + 1;
          if (bVar3) goto LAB_00116a8a;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)local_98,__it._M_current + 2);
          ptVar5 = local_70;
          __position_00._M_current = __it._M_current + 2;
          if (bVar3) goto LAB_00116a8a;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)local_98,__it._M_current + 3);
          ptVar5 = local_70;
          __position_00._M_current = __it._M_current + 3;
          if (bVar3) goto LAB_00116a8a;
          __it._M_current = __it._M_current + 4;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      lVar6 = ((long)ptVar5 - (long)__it_00._M_current >> 3) * -0x3333333333333333;
      if (lVar6 == 1) {
LAB_00116a73:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                              *)local_98,__it_00);
        __position_00._M_current = __it_00._M_current;
        if (!bVar3) {
          __position_00._M_current = ptVar5;
        }
      }
      else if (lVar6 == 2) {
LAB_00116a53:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                              *)local_98,__it_00);
        __position_00._M_current = __it_00._M_current;
        if (!bVar3) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_00116a73;
        }
      }
      else {
        __position_00._M_current = ptVar5;
        if ((lVar6 == 3) &&
           (bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                    ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                  *)local_98,__it_00), __position_00._M_current = __it_00._M_current
           , !bVar3)) {
          __it_00._M_current = __it_00._M_current + 1;
          goto LAB_00116a53;
        }
      }
LAB_00116a8a:
      if (__position_00._M_current == ptVar5) {
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::push_back(&local_58,(value_type *)__position);
        __position = (_Tuple_impl<1UL,_int,_int>)
                     std::
                     vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                     ::_M_erase(local_60,(iterator)__position);
      }
      else {
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::_M_erase(vNewListing,(iterator)__position_00._M_current);
        __position = (_Tuple_impl<1UL,_int,_int>)((long)__position + 0x28);
      }
    } while (__position !=
             (_Tuple_impl<1UL,_int,_int>)
             (local_68->m_vCurIPAddr).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar2 = local_68;
  p_Var7 = (_Tuple_impl<1UL,_int,_int> *)
           (vNewListing->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Tuple_impl<1UL,_int,_int> *)
           (vNewListing->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var7 != p_Var1) {
    do {
      local_98 = *(undefined1 (*) [8])p_Var7;
      local_90._M_dataplus._M_p = local_98 + 0x18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_98 + 8),p_Var7[1],(long)p_Var7[2] + (long)p_Var7[1]);
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::push_back(local_60,(value_type *)local_98);
      if (local_90._M_dataplus._M_p != local_98 + 0x18) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = p_Var7 + 5;
    } while (p_Var7 != p_Var1);
  }
  pthread_mutex_unlock(local_38);
  ptVar5 = local_58.
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pIVar2->m_fnCbAddrNotify).super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &pIVar2->m_fnCbAddrNotify;
    if (local_58.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var7 = (_Tuple_impl<1UL,_int,_int> *)
               local_58.
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_98 = *(undefined1 (*) [8])p_Var7;
        local_90._M_dataplus._M_p = local_98 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_98 + 8),p_Var7[1],(long)p_Var7[2] + (long)p_Var7[1]);
        std::
        function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
        ::operator()(this_00,false,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8),local_98._4_4_,local_98._0_4_);
        if (local_90._M_dataplus._M_p != local_98 + 0x18) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = p_Var7 + 5;
      } while (p_Var7 != (_Tuple_impl<1UL,_int,_int> *)ptVar5);
    }
    p_Var7 = (_Tuple_impl<1UL,_int,_int> *)
             (vNewListing->
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var1 = (_Tuple_impl<1UL,_int,_int> *)
             (vNewListing->
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var7 != p_Var1) {
      do {
        local_98 = *(undefined1 (*) [8])p_Var7;
        local_90._M_dataplus._M_p = local_98 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_98 + 8),p_Var7[1],(long)p_Var7[2] + (long)p_Var7[1]);
        std::
        function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
        ::operator()(this_00,true,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8),local_98._4_4_,local_98._0_4_);
        if (local_90._M_dataplus._M_p != local_98 + 0x18) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = p_Var7 + 5;
      } while (p_Var7 != p_Var1);
    }
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void InitSocket::NotifyOnAddressChanges(vector<tuple<string, int, int>>& vNewListing)
{
    vector<tuple<string, int, int>> vDelIPAddr;

    m_mxCurIpAddr.lock();
    // remove all IP addr. in the vector that where before available
    for (auto iter = begin(m_vCurIPAddr); iter != end(m_vCurIPAddr);)
    {
        auto itFound = find_if(begin(vNewListing), end(vNewListing), [iter](auto& item) { return get<0>(*iter) == get<0>(item) ? true : false; });
        if (itFound != end(vNewListing))
            vNewListing.erase(itFound);  // address existed before, so remove it from the list with our new addresses
        else
        {   // the IP does not exist any more
            vDelIPAddr.push_back(*iter);    // remember witch one was removed
            iter = m_vCurIPAddr.erase(iter);
            continue;
        }
        ++iter;
    }

    for (auto iter : vNewListing)
        m_vCurIPAddr.push_back(iter);    // remember witch one was removed

    m_mxCurIpAddr.unlock();

    if (m_fnCbAddrNotify)
    {
        // Notify on all deleted IP addresses
        for (auto iter : vDelIPAddr)
            m_fnCbAddrNotify(false, get<0>(iter), get<1>(iter), get<2>(iter));
        // Notify on all new IP addresses
        for (auto iter : vNewListing)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }
}